

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O2

bool PSBTInputSignedAndVerified
               (PartiallySignedTransaction psbt,uint input_index,PrecomputedTransactionData *txdata)

{
  long *plVar1;
  uchar *puVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  ulong in_RDX;
  undefined4 uVar9;
  ulong uVar10;
  undefined4 in_register_0000003c;
  long *plVar11;
  long in_FS_OFFSET;
  COutPoint prevout;
  undefined4 uStack_54;
  CTxOut utxo;
  
  plVar11 = (long *)CONCAT44(in_register_0000003c,input_index);
  uVar10 = (ulong)txdata & 0xffffffff;
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  CTxOut::CTxOut(&utxo);
  lVar5 = plVar11[0xe];
  if ((ulong)((plVar11[0xf] - lVar5) / 800) < uVar10) {
    __assert_fail("psbt.inputs.size() >= input_index",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/psbt.cpp"
                  ,0x12d,
                  "bool PSBTInputSignedAndVerified(const PartiallySignedTransaction, unsigned int, const PrecomputedTransactionData *)"
                 );
  }
  plVar1 = (long *)(lVar5 + uVar10 * 800);
  lVar5 = *(long *)(lVar5 + uVar10 * 800);
  uVar9 = SUB84(txdata,0);
  if (lVar5 == 0) {
    if (plVar1[2] != -1) {
      CTxOut::operator=(&utxo,(CTxOut *)(plVar1 + 2));
      goto LAB_0058df00;
    }
  }
  else {
    lVar6 = *plVar11;
    lVar8 = uVar10 * 0x68;
    prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(lVar6 + lVar8);
    prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((uchar *)(lVar6 + lVar8) + 8);
    puVar2 = (uchar *)(lVar6 + 0x10 + lVar8);
    prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)puVar2;
    prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)(puVar2 + 8);
    uVar3 = *(uint *)(lVar6 + 0x20 + lVar8);
    stack0xffffffffffffffa8 = CONCAT44(uStack_54,uVar3);
    if (((ulong)uVar3 < (ulong)((*(long *)(lVar5 + 0x20) - *(long *)(lVar5 + 0x18)) / 0x28)) &&
       (bVar7 = transaction_identifier<false>::operator!=
                          ((transaction_identifier<false> *)(lVar5 + 0x39),&prevout.hash), !bVar7))
    {
      CTxOut::operator=(&utxo,(CTxOut *)
                              ((stack0xffffffffffffffa8 & 0xffffffff) * 0x28 +
                              *(long *)(*plVar1 + 0x18)));
LAB_0058df00:
      prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = plVar11;
      if (in_RDX == 0) {
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
             &PTR_CheckECDSASignature_00a1b840;
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = (char)uVar9;
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
             (char)((uint)uVar9 >> 8);
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
             (char)((uint)uVar9 >> 0x10);
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
             (char)((uint)uVar9 >> 0x18);
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\x01';
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = (undefined1)utxo.nValue
        ;
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = utxo.nValue._1_1_;
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = utxo.nValue._2_1_;
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = utxo.nValue._3_1_;
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = utxo.nValue._4_1_;
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = utxo.nValue._5_1_;
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = utxo.nValue._6_1_;
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = utxo.nValue._7_1_;
        stack0xffffffffffffffa8 = 0;
        bVar7 = VerifyScript((CScript *)(plVar1 + 0xf),&utxo.scriptPubKey,
                             (CScriptWitness *)(plVar1 + 0x13),0x1fffdf,
                             (BaseSignatureChecker *)&prevout,(ScriptError *)0x0);
      }
      else {
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
             &PTR_CheckECDSASignature_00a1b840;
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = (char)uVar9;
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
             (char)((uint)uVar9 >> 8);
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
             (char)((uint)uVar9 >> 0x10);
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
             (char)((uint)uVar9 >> 0x18);
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\x01';
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = (undefined1)utxo.nValue
        ;
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = utxo.nValue._1_1_;
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = utxo.nValue._2_1_;
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = utxo.nValue._3_1_;
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = utxo.nValue._4_1_;
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = utxo.nValue._5_1_;
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = utxo.nValue._6_1_;
        prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = utxo.nValue._7_1_;
        unique0x10000286 = in_RDX;
        bVar7 = VerifyScript((CScript *)(plVar1 + 0xf),&utxo.scriptPubKey,
                             (CScriptWitness *)(plVar1 + 0x13),0x1fffdf,
                             (BaseSignatureChecker *)&prevout,(ScriptError *)0x0);
      }
      goto LAB_0058df8d;
    }
  }
  bVar7 = false;
LAB_0058df8d:
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&utxo.scriptPubKey.super_CScriptBase)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool PSBTInputSignedAndVerified(const PartiallySignedTransaction psbt, unsigned int input_index, const PrecomputedTransactionData* txdata)
{
    CTxOut utxo;
    assert(psbt.inputs.size() >= input_index);
    const PSBTInput& input = psbt.inputs[input_index];

    if (input.non_witness_utxo) {
        // If we're taking our information from a non-witness UTXO, verify that it matches the prevout.
        COutPoint prevout = psbt.tx->vin[input_index].prevout;
        if (prevout.n >= input.non_witness_utxo->vout.size()) {
            return false;
        }
        if (input.non_witness_utxo->GetHash() != prevout.hash) {
            return false;
        }
        utxo = input.non_witness_utxo->vout[prevout.n];
    } else if (!input.witness_utxo.IsNull()) {
        utxo = input.witness_utxo;
    } else {
        return false;
    }

    if (txdata) {
        return VerifyScript(input.final_script_sig, utxo.scriptPubKey, &input.final_script_witness, STANDARD_SCRIPT_VERIFY_FLAGS, MutableTransactionSignatureChecker{&(*psbt.tx), input_index, utxo.nValue, *txdata, MissingDataBehavior::FAIL});
    } else {
        return VerifyScript(input.final_script_sig, utxo.scriptPubKey, &input.final_script_witness, STANDARD_SCRIPT_VERIFY_FLAGS, MutableTransactionSignatureChecker{&(*psbt.tx), input_index, utxo.nValue, MissingDataBehavior::FAIL});
    }
}